

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandGetInv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Wlc_Ntk_t *pNtk_00;
  Wlc_Ntk_t *pWVar2;
  Vec_Int_t *pVVar3;
  Vec_Str_t *vSop;
  Abc_Ntk_t *pNtk_01;
  char *pcVar4;
  uint local_40;
  int fVerbose;
  int c;
  Wlc_Ntk_t *pNtk;
  Abc_Ntk_t *pMainNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Wlc_AbcGetNtk(pAbc);
  local_40 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Wlc_Ntk_t *)0x0) {
        Abc_Print(1,"Abc_CommandGetInv(): There is no current design.\n");
      }
      else {
        pWVar2 = Wlc_AbcGetNtk(pAbc);
        if (pWVar2 == (Wlc_Ntk_t *)0x0) {
          Abc_Print(1,"Abc_CommandGetInv(): There is no saved invariant.\n");
        }
        else {
          pVVar3 = Wlc_AbcGetInv(pAbc);
          if (pVVar3 == (Vec_Int_t *)0x0) {
            Abc_Print(1,"Abc_CommandGetInv(): Invariant is not available.\n");
          }
          else {
            pVVar3 = Wlc_AbcGetInv(pAbc);
            vSop = Wlc_AbcGetStr(pAbc);
            pNtk_01 = Wlc_NtkGetInv(pNtk_00,pVVar3,vSop,local_40);
            Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_01);
          }
        }
      }
      return 0;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_40 = local_40 ^ 1;
  }
  Abc_Print(-2,"usage: %%getinv [-vh]\n");
  Abc_Print(-2,"\t         places invariant found by PDR as the current network in the main-space\n"
           );
  Abc_Print(-2,"\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n");
  pcVar4 = "no";
  if (local_40 != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandGetInv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Wlc_NtkGetInv( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, Vec_Str_t * vSop, int fVerbose );
    Abc_Ntk_t * pMainNtk;
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandGetInv(): There is no current design.\n" );
        return 0;
    }
    if ( Wlc_AbcGetNtk(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandGetInv(): There is no saved invariant.\n" );
        return 0;
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandGetInv(): Invariant is not available.\n" );
        return 0;
    }
    // derive the network
    pMainNtk = Wlc_NtkGetInv( pNtk, Wlc_AbcGetInv(pAbc), Wlc_AbcGetStr(pAbc), fVerbose );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pMainNtk );
    return 0;
    usage:
    Abc_Print( -2, "usage: %%getinv [-vh]\n" );
    Abc_Print( -2, "\t         places invariant found by PDR as the current network in the main-space\n" );
    Abc_Print( -2, "\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}